

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O2

qsizetype __thiscall
QtPrivate::findByteArray(QtPrivate *this,QByteArrayView haystack,qsizetype from,char needle)

{
  void *pvVar1;
  storage_type *psVar2;
  char *b;
  storage_type *psVar3;
  
  psVar2 = haystack.m_data;
  psVar3 = (storage_type *)0x0;
  if (0 < (long)(psVar2 + (long)this)) {
    psVar3 = psVar2 + (long)this;
  }
  if (-1 < (long)psVar2) {
    psVar3 = psVar2;
  }
  if (((long)this - (long)psVar3 != 0 && (long)psVar3 <= (long)this) &&
     (pvVar1 = memchr(psVar3 + haystack.m_size,(int)(char)from,(long)this - (long)psVar3),
     pvVar1 != (void *)0x0)) {
    return (long)pvVar1 - haystack.m_size;
  }
  return -1;
}

Assistant:

qsizetype QtPrivate::findByteArray(QByteArrayView haystack, qsizetype from, char needle) noexcept
{
    if (from < 0)
        from = qMax(from + haystack.size(), qsizetype(0));
    if (from < haystack.size()) {
        const char *const b = haystack.data();
        if (const auto n = static_cast<const char *>(
                    memchr(b + from, needle, static_cast<size_t>(haystack.size() - from)))) {
            return n - b;
        }
    }
    return -1;
}